

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O0

int64_t __thiscall
aeron::DriverProxy::addCounter
          (DriverProxy *this,int32_t typeId,uint8_t *key,size_t keyLength,string *label)

{
  int64_t iVar1;
  undefined8 *in_RDI;
  int64_t correlationId;
  anon_class_48_6_e1d6f653 *in_stack_00000288;
  DriverProxy *in_stack_00000290;
  
  iVar1 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    ((ManyToOneRingBuffer *)*in_RDI);
  writeCommandToDriver<aeron::DriverProxy::addCounter(int,unsigned_char_const*,unsigned_long,std::__cxx11::string_const&)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (in_stack_00000290,in_stack_00000288);
  return iVar1;
}

Assistant:

std::int64_t addCounter(std::int32_t typeId, const std::uint8_t *key, std::size_t keyLength, const std::string& label)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            CounterMessageFlyweight command(buffer, 0);

            command.clientId(m_clientId);
            command.correlationId(correlationId);
            command.typeId(typeId);
            command.keyBuffer(key, keyLength);
            command.label(label);

            length = command.length();

            return ControlProtocolEvents::ADD_COUNTER;
        });

        return correlationId;
    }